

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O0

void si9ma::Trie::insert(TrieNode *root,string *str)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  TrieNode *this;
  int local_24;
  int index;
  int i;
  TrieNode *cur;
  string *str_local;
  TrieNode *root_local;
  
  root->pass = root->pass + 1;
  local_24 = 0;
  _index = root;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= (ulong)(long)local_24) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
    iVar1 = *pcVar3 + -0x61;
    if (_index->nexts[iVar1] == (TrieNode *)0x0) {
      this = (TrieNode *)operator_new(0xd8);
      TrieNode::TrieNode(this,0,0);
      _index->nexts[iVar1] = this;
    }
    _index->nexts[iVar1]->pass = _index->nexts[iVar1]->pass + 1;
    _index = _index->nexts[iVar1];
    local_24 = local_24 + 1;
  }
  _index->end = _index->end + 1;
  return;
}

Assistant:

void Trie::insert(TrieNode *root,const string &str) {
        root->pass ++;
        auto *cur = root;

        for (int i = 0; i < str.length(); ++i) {
            int index = str[i] - 'a';

            if (cur->nexts[index] == nullptr){
                cur->nexts[index] = new TrieNode(0,0);
            }
            cur->nexts[index]->pass++;
            cur = cur->nexts[index];
        }

        cur->end ++;
    }